

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_bind_state.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::SelectBindState::BindAlias(SelectBindState *this,idx_t index)

{
  long *plVar1;
  pointer pcVar2;
  reference pvVar3;
  pointer pPVar4;
  BinderException *this_00;
  __hash_code __code;
  ulong in_RDX;
  ulong uVar5;
  long *plVar6;
  long *plVar7;
  __node_gen_type __node_gen;
  size_type local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar5 = in_RDX % *(ulong *)(index + 200);
  plVar6 = *(long **)(*(long *)(index + 0xc0) + uVar5 * 8);
  plVar7 = (long *)0x0;
  if ((plVar6 != (long *)0x0) &&
     (plVar1 = (long *)*plVar6, plVar7 = plVar6, ((long *)*plVar6)[1] != in_RDX)) {
    while (plVar6 = plVar1, plVar1 = (long *)*plVar6, plVar1 != (long *)0x0) {
      plVar7 = (long *)0x0;
      if (((ulong)plVar1[1] % *(ulong *)(index + 200) != uVar5) ||
         (plVar7 = plVar6, plVar1[1] == in_RDX)) goto LAB_01214240;
    }
    plVar7 = (long *)0x0;
  }
LAB_01214240:
  local_70 = in_RDX;
  if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
    this_00 = (BinderException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "Alias \"%s\" referenced - but the expression has side effects. This is not yet supported."
               ,"");
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                           *)(index + 0x70),local_70);
    pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar3);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar2 = (pPVar4->super_BaseExpression).alias._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,
               pcVar2 + (pPVar4->super_BaseExpression).alias._M_string_length);
    BinderException::BinderException<std::__cxx11::string>(this_00,&local_68,&local_48);
    __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_68._M_dataplus._M_p = (pointer)(index + 0x88);
  ::std::
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
            ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_68._M_dataplus._M_p,&local_70);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                         *)(index + 0x70),local_70);
  pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(pvVar3);
  (*(pPVar4->super_BaseExpression)._vptr_BaseExpression[0xc])(this,pPVar4);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> SelectBindState::BindAlias(idx_t index) {
	if (volatile_expressions.find(index) != volatile_expressions.end()) {
		throw BinderException("Alias \"%s\" referenced - but the expression has side "
		                      "effects. This is not yet supported.",
		                      original_expressions[index]->GetAlias());
	}
	referenced_aliases.insert(index);
	return original_expressions[index]->Copy();
}